

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandInduction(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_50;
  int c;
  int fVeryVerbose;
  int fVerbose;
  int fGetCex;
  int fUniqueAll;
  int fUnique;
  int nConfMax;
  int nFramesMax;
  int nTimeOut;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nConfMax = 0;
  fUnique = 0;
  fUniqueAll = 0;
  fGetCex = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  c = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
LAB_00297c4f:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FCTuaxvwh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsComb(pNtk_00);
      if (iVar1 != 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      iVar1 = Abc_NtkPoNum(pNtk_00);
      if (iVar1 != 1) {
        Abc_Print(-1,"Currently this command works only for single-output miter.\n");
        return 0;
      }
      if ((fGetCex != 0) && (fVerbose != 0)) {
        Abc_Print(-1,"Only one of the options, \"-u\" or \"-a\", should be selected.\n");
        return 0;
      }
      iVar1 = Abc_NtkDarInduction(pNtk_00,nConfMax,fUnique,fUniqueAll,fGetCex,fVerbose,fVeryVerbose,
                                  c,local_50);
      pAbc->Status = iVar1;
      if (fVeryVerbose != 0) {
        Abc_FrameReplaceCex(pAbc,&pNtk_00->pSeqModel);
        Abc_Print(1,"The current CEX in ABC is set to be the CEX to induction.\n");
      }
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00297f58;
      }
      fUniqueAll = atoi(argv[globalUtilOptind]);
      iVar1 = fUniqueAll;
      break;
    default:
      goto LAB_00297f58;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00297f58;
      }
      fUnique = atoi(argv[globalUtilOptind]);
      iVar1 = fUnique;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00297f58;
      }
      nConfMax = atoi(argv[globalUtilOptind]);
      iVar1 = nConfMax;
      break;
    case 0x61:
      fVerbose = fVerbose ^ 1;
      goto LAB_00297c4f;
    case 0x68:
      goto LAB_00297f58;
    case 0x75:
      fGetCex = fGetCex ^ 1;
      goto LAB_00297c4f;
    case 0x76:
      c = c ^ 1;
      goto LAB_00297c4f;
    case 0x77:
      local_50 = local_50 ^ 1;
      goto LAB_00297c4f;
    case 0x78:
      fVeryVerbose = fVeryVerbose ^ 1;
      goto LAB_00297c4f;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00297f58:
      Abc_Print(-2,"usage: ind [-FCT num] [-uaxvwh]\n");
      Abc_Print(-2,"\t         runs the inductive case of the K-step induction\n");
      Abc_Print(-2,"\t-F num : the max number of timeframes [default = %d]\n",(ulong)(uint)fUnique);
      Abc_Print(-2,"\t-C num : the max number of conflicts by SAT solver [default = %d]\n",
                (ulong)(uint)fUniqueAll);
      Abc_Print(-2,"\t-T num : the limit on runtime per output in seconds [default = %d]\n",
                (ulong)(uint)nConfMax);
      pcVar2 = "no";
      if (fGetCex != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-u     : toggle adding uniqueness constraints on demand [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle adding uniqueness constraints always [default = %s]\n",pcVar2)
      ;
      pcVar2 = "no";
      if (fVeryVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle returning CEX to induction for the top frame [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_50 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",
                pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandInduction( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nTimeOut;
    int nFramesMax;
    int nConfMax;
    int fUnique;
    int fUniqueAll;
    int fGetCex;
    int fVerbose;
    int fVeryVerbose;
    int c;
    extern int Abc_NtkDarInduction( Abc_Ntk_t * pNtk, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose );
    // set defaults
    nTimeOut     =     0;
    nFramesMax   =     0;
    nConfMax     =     0;
    fUnique      =     0;
    fUniqueAll   =     0;
    fGetCex      =     0;
    fVerbose     =     0;
    fVeryVerbose =     0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCTuaxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'u':
            fUnique ^= 1;
            break;
        case 'a':
            fUniqueAll ^= 1;
            break;
        case 'x':
            fGetCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently this command works only for single-output miter.\n" );
        return 0;
    }
    if ( fUnique && fUniqueAll )
    {
        Abc_Print( -1, "Only one of the options, \"-u\" or \"-a\", should be selected.\n" );
        return 0;
    }

    // modify the current network
    pAbc->Status = Abc_NtkDarInduction( pNtk, nTimeOut, nFramesMax, nConfMax, fUnique, fUniqueAll, fGetCex, fVerbose, fVeryVerbose );
    if ( fGetCex )
    {
        Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
        Abc_Print( 1,"The current CEX in ABC is set to be the CEX to induction.\n" );
    }
    return 0;
usage:
    Abc_Print( -2, "usage: ind [-FCT num] [-uaxvwh]\n" );
    Abc_Print( -2, "\t         runs the inductive case of the K-step induction\n" );
    Abc_Print( -2, "\t-F num : the max number of timeframes [default = %d]\n", nFramesMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts by SAT solver [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-T num : the limit on runtime per output in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-u     : toggle adding uniqueness constraints on demand [default = %s]\n", fUnique? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle adding uniqueness constraints always [default = %s]\n", fUniqueAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle returning CEX to induction for the top frame [default = %s]\n", fGetCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}